

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O2

FSerializer * __thiscall
FSerializer::Array<unsigned_int>(FSerializer *this,char *key,uint *obj,int count,bool fullcompare)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  
  if ((((!save_full) && (fullcompare)) && (this->w != (FWriter *)0x0)) &&
     (bVar1 = nullcmp(obj,(long)count << 2), bVar1)) {
    return this;
  }
  bVar1 = BeginArray(this,key);
  if (bVar1) {
    if ((this->r != (FReader *)0x0) && (uVar2 = ArraySize(this), (int)uVar2 < count)) {
      count = uVar2;
    }
    uVar3 = (ulong)(uint)count;
    if (count < 1) {
      uVar3 = 0;
    }
    while (bVar1 = uVar3 != 0, uVar3 = uVar3 - 1, bVar1) {
      ::Serialize(this,(char *)0x0,obj,(uint32_t *)0x0);
      obj = obj + 1;
    }
    EndArray(this);
  }
  return this;
}

Assistant:

FSerializer &Array(const char *key, T *obj, int count, bool fullcompare = false)
	{
		if (!save_full && fullcompare && isWriting() && nullcmp(obj, count * sizeof(T)))
		{
			return *this;
		}

		if (BeginArray(key))
		{
			if (isReading())
			{
				int max = ArraySize();
				if (max < count) count = max;
			}
			for (int i = 0; i < count; i++)
			{
				Serialize(*this, nullptr, obj[i], (T*)nullptr);
			}
			EndArray();
		}
		return *this;
	}